

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall kj::anon_unknown_8::DiskHandle::exists(DiskHandle *this,PathPtr path)

{
  Fault local_50;
  Fault f;
  undefined1 auStack_40 [4];
  int error;
  PathPtr *local_38;
  int local_2c;
  DiskHandle *pDStack_28;
  int _kjSyscallError;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  local_38 = (PathPtr *)&this_local;
  _auStack_40 = this;
  pDStack_28 = this;
  f.exception._4_4_ =
       _::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::exists(kj::PathPtr)const::_lambda()_1_>
                 ((anon_class_16_2_3fe44de0 *)auStack_40,false);
  if (f.exception._4_4_ == 0) {
    path_local.parts.size_._7_1_ = 1;
  }
  else if ((f.exception._4_4_ == 2) || (f.exception._4_4_ == 0x14)) {
    path_local.parts.size_._7_1_ = 0;
  }
  else {
    local_2c = f.exception._4_4_;
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2d0,f.exception._4_4_,"faccessat(fd, path)","path",(PathPtr *)&this_local);
    path_local.parts.size_._7_1_ = 0;
    _::Debug::Fault::~Fault(&local_50);
  }
  return (bool)(path_local.parts.size_._7_1_ & 1);
}

Assistant:

bool exists(PathPtr path) const {
    KJ_SYSCALL_HANDLE_ERRORS(faccessat(fd, path.toString().cStr(), F_OK, 0)) {
      case ENOENT:
      case ENOTDIR:
        return false;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return false; }
    }
    return true;
  }